

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O0

int __thiscall FSectorTagIterator::Next(FSectorTagIterator *this)

{
  FTagItem *pFVar1;
  bool bVar2;
  bool local_2a;
  int local_1c;
  int ret;
  FSectorTagIterator *this_local;
  
  if (this->searchtag == -0x80000000) {
    local_1c = this->start;
    this->start = -1;
  }
  else if (this->searchtag == 0) {
    while( true ) {
      local_2a = false;
      if (this->start < numsectors) {
        local_2a = FTagManager::SectorHasTags(&tagManager,this->start);
      }
      if (local_2a == false) break;
      this->start = this->start + 1;
    }
    if (this->start == numsectors) {
      return -1;
    }
    local_1c = this->start;
    this->start = this->start + 1;
  }
  else {
    while( true ) {
      bVar2 = false;
      if (-1 < this->start) {
        pFVar1 = TArray<FTagItem,_FTagItem>::operator[](&tagManager.allTags,(long)this->start);
        bVar2 = pFVar1->tag != this->searchtag;
      }
      if (!bVar2) break;
      pFVar1 = TArray<FTagItem,_FTagItem>::operator[](&tagManager.allTags,(long)this->start);
      this->start = pFVar1->nexttag;
    }
    if (this->start == -1) {
      return -1;
    }
    pFVar1 = TArray<FTagItem,_FTagItem>::operator[](&tagManager.allTags,(long)this->start);
    local_1c = pFVar1->target;
    pFVar1 = TArray<FTagItem,_FTagItem>::operator[](&tagManager.allTags,(long)this->start);
    this->start = pFVar1->nexttag;
  }
  return local_1c;
}

Assistant:

int FSectorTagIterator::Next()
{
	int ret;
	if (searchtag == INT_MIN)
	{
		ret = start;
		start = -1;
	}
	else if (searchtag != 0)
	{
		while (start >= 0 && tagManager.allTags[start].tag != searchtag) start = tagManager.allTags[start].nexttag;
		if (start == -1) return -1;
		ret = tagManager.allTags[start].target;
		start = tagManager.allTags[start].nexttag;
	}
	else
	{
		// with the tag manager, searching for tag 0 has to be different, because it won't create entries for untagged sectors.
		while (start < numsectors && tagManager.SectorHasTags(start))
		{
			start++;
		}
		if (start == numsectors) return -1;
		ret = start;
		start++;
	}
	return ret;
}